

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HebrewCalendar.cpp
# Opt level: O3

void __thiscall HebrewCalendar::HebrewCalendar(HebrewCalendar *this,int d)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int month;
  HebrewCalendar local_48;
  
  (this->super_Calendar).month = 1;
  (this->super_Calendar).day = 1;
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105d90;
  iVar1 = (int)((ulong)((long)(d + -0x14f4f5) * -0x4cf09cad) >> 0x20) + d + -0x14f4f5;
  iVar1 = ((iVar1 >> 8) - (iVar1 >> 0x1f)) + -1;
  do {
    local_48.super_Calendar.year = iVar1 + 2;
    local_48.super_Calendar.month = 7;
    local_48.super_Calendar.day = 1;
    local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105d90;
    iVar2 = operator_cast_to_int(&local_48);
    iVar1 = iVar1 + 1;
  } while (iVar2 <= d);
  (this->super_Calendar).year = iVar1;
  local_48.super_Calendar.month = 1;
  local_48.super_Calendar.day = 1;
  local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105d90;
  local_48.super_Calendar.year = iVar1;
  iVar3 = operator_cast_to_int(&local_48);
  iVar2 = 1;
  if (d < iVar3) {
    iVar2 = 7;
  }
  do {
    month = iVar2;
    local_48.super_Calendar.day = LastMonthDay(this,month,iVar1);
    local_48.super_Calendar.month = month;
    local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105d90;
    local_48.super_Calendar.year = iVar1;
    iVar3 = operator_cast_to_int(&local_48);
    iVar2 = month + 1;
  } while (iVar3 < d);
  (this->super_Calendar).month = month;
  local_48.super_Calendar.day = 1;
  local_48.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_00105d90;
  local_48.super_Calendar.year = iVar1;
  iVar1 = operator_cast_to_int(&local_48);
  (this->super_Calendar).day = (d - iVar1) + 1;
  return;
}

Assistant:

HebrewCalendar::HebrewCalendar(int d) { // Computes the HebrewCalendar date from the absolute date.
    year = (d + HebrewEpoch) / 366; // Approximation from below.
    // Search forward for year from the approximation.
    while (d >= HebrewCalendar(7, 1, year + 1))
        year++;
    // Search forward for month from either Tishri or Nisan.
    if (d < HebrewCalendar(1, 1, year))
        month = 7;  //  Start at Tishri
    else
        month = 1;  //  Start at Nisan
    while (d > HebrewCalendar(month, (LastMonthDay(month, year)), year))
        month++;
    // Calculate the day by subtraction.
    day = d - HebrewCalendar(month, 1, year) + 1;
}